

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# purearray.cpp
# Opt level: O1

void __thiscall PureArray::setValue(PureArray *this,int v)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  
  if (0 < (this->super_Array)._height) {
    uVar1 = 0;
    do {
      if (0 < (this->super_Array)._width) {
        uVar3 = 0;
        do {
          (*(this->super_Array)._vptr_Array[3])(this,v,uVar3,uVar1);
          uVar2 = (int)uVar3 + 1;
          uVar3 = (ulong)uVar2;
        } while ((int)uVar2 < (this->super_Array)._width);
      }
      uVar2 = (int)uVar1 + 1;
      uVar1 = (ulong)uVar2;
    } while ((int)uVar2 < (this->super_Array)._height);
  }
  return;
}

Assistant:

void PureArray::setValue(int v)
{
	for (int i = 0; i < getHeight(); ++i) {
		for (int j = 0; j < getWidth(); ++j) {
			setData(v, j, i);
		}
	}
}